

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

ggml_tensor * ggml_set_f32(ggml_tensor *tensor,float value)

{
  int n_00;
  size_t sVar1;
  void *pvVar2;
  ggml_bf16_t v;
  int iVar3;
  ggml_tensor *in_RDI;
  float in_XMM0_Da;
  undefined1 auVar4 [16];
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  char *data;
  size_t n1;
  int nc;
  int n;
  int local_64;
  int local_5c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar3 = ggml_nrows(in_RDI);
  n_00 = (int)in_RDI->ne[0];
  sVar1 = in_RDI->nb[1];
  pvVar2 = in_RDI->data;
  switch(in_RDI->type) {
  case GGML_TYPE_F32:
    for (local_64 = 0; local_64 < iVar3; local_64 = local_64 + 1) {
      ggml_vec_set_f32(n_00,(float *)((long)pvVar2 + (long)local_64 * sVar1),in_XMM0_Da);
    }
    break;
  case GGML_TYPE_F16:
    for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
      auVar4 = vcvtps2ph_f16c(ZEXT416((uint)in_XMM0_Da),0);
      ggml_vec_set_f16(n_00,(ggml_fp16_t *)((long)pvVar2 + (long)local_38 * sVar1),auVar4._0_2_);
    }
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x37b,"fatal error");
  case GGML_TYPE_I8:
    for (local_2c = 0; local_2c < iVar3; local_2c = local_2c + 1) {
      ggml_vec_set_i8(n_00,(int8_t *)((long)pvVar2 + (long)local_2c * sVar1),(int8_t)(int)in_XMM0_Da
                     );
    }
    break;
  case GGML_TYPE_I16:
    for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
      ggml_vec_set_i16(n_00,(int16_t *)((long)pvVar2 + (long)local_30 * sVar1),
                       (int16_t)(int)in_XMM0_Da);
    }
    break;
  case GGML_TYPE_I32:
    for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
      ggml_vec_set_i32(n_00,(int32_t *)((long)pvVar2 + (long)local_34 * sVar1),(int)in_XMM0_Da);
    }
    break;
  case GGML_TYPE_BF16:
    for (local_5c = 0; local_5c < iVar3; local_5c = local_5c + 1) {
      v = ggml_compute_fp32_to_bf16(in_XMM0_Da);
      ggml_vec_set_bf16(n_00,(ggml_bf16_t *)((long)pvVar2 + (long)local_5c * sVar1),v);
    }
  }
  return in_RDI;
}

Assistant:

struct ggml_tensor * ggml_set_f32(struct ggml_tensor * tensor, float value) {
    const int n     = ggml_nrows(tensor);
    const int nc    = tensor->ne[0];
    const size_t n1 = tensor->nb[1];

    char * const data = tensor->data;

    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                assert(tensor->nb[0] == sizeof(int8_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i8(nc, (int8_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I16:
            {
                assert(tensor->nb[0] == sizeof(int16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i16(nc, (int16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I32:
            {
                assert(tensor->nb[0] == sizeof(int32_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i32(nc, (int32_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F16:
            {
                assert(tensor->nb[0] == sizeof(ggml_fp16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f16(nc, (ggml_fp16_t *)(data + i*n1), GGML_FP32_TO_FP16(value));
                }
            } break;
        case GGML_TYPE_BF16:
            {
                assert(tensor->nb[0] == sizeof(ggml_bf16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_bf16(nc, (ggml_bf16_t *)(data + i*n1), GGML_FP32_TO_BF16(value));
                }
            } break;
        case GGML_TYPE_F32:
            {
                assert(tensor->nb[0] == sizeof(float));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f32(nc, (float *)(data + i*n1), value);
                }
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }

    return tensor;
}